

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

bool __thiscall presolve::HPresolve::isImpliedEquationAtLower(HPresolve *this,HighsInt row)

{
  double *pdVar1;
  const_reference pvVar2;
  int in_ESI;
  long in_RDI;
  bool isLbndPositive;
  
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x220),(long)in_ESI);
  pdVar1 = (double *)(*(long *)(in_RDI + 8) + 0x120);
  return *pdVar1 <= *pvVar2 && *pvVar2 != *pdVar1;
}

Assistant:

bool HPresolve::isImpliedEquationAtLower(HighsInt row) const {
  // if the implied lower bound on a row dual is strictly positive then the row
  // is an implied equation (using its lower bound) due to complementary
  // slackness
  bool isLbndPositive =
      implRowDualLower[row] > options->dual_feasibility_tolerance;
  assert(!isLbndPositive || model->row_lower_[row] != -kHighsInf);
  return isLbndPositive;
}